

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution.cpp
# Opt level: O2

int ncnn::deconvolution(Mat *bottom_blob,Mat *top_blob,Mat *weight_data,Mat *bias_data,int kernel_w,
                       int kernel_h,int stride_w,int stride_h,int dilation_w,int dilation_h,
                       int activation_type,Mat *activation_params,Option *opt)

{
  float fVar1;
  uint uVar2;
  size_t sVar3;
  void *pvVar4;
  size_t sVar5;
  size_t sVar6;
  void *pvVar7;
  float *pfVar8;
  int i;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int extraout_EAX;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  uint uVar21;
  void *pvVar22;
  void *pvVar23;
  long lVar24;
  ulong uVar25;
  int k;
  ulong uVar26;
  bool bVar27;
  undefined4 uVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  vector<int,_std::allocator<int>_> _space_ofs;
  int local_100;
  allocator_type local_f9;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  void *local_e0;
  Mat *local_d8;
  Mat *local_d0;
  int local_c4;
  int local_c0;
  int local_bc;
  long local_b8;
  Mat *local_b0;
  ulong local_a8;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  void *local_90;
  void *local_88;
  ulong local_80;
  long local_78;
  ulong local_70;
  long local_68;
  Mat *local_60;
  void *local_58;
  ulong local_50;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  iVar12 = top_blob->w;
  local_f8 = (ulong)(uint)top_blob->c;
  uVar9 = kernel_h * kernel_w;
  local_d8 = top_blob;
  local_d0 = bias_data;
  local_b0 = bottom_blob;
  local_60 = weight_data;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_48,(long)(int)uVar9,&local_f9);
  iVar10 = dilation_w * kernel_w;
  iVar11 = 0;
  if (kernel_w < 1) {
    kernel_w = 0;
  }
  if (kernel_h < 1) {
    kernel_h = iVar11;
  }
  iVar16 = 0;
  iVar20 = 0;
  iVar15 = kernel_w;
  for (; iVar11 != kernel_h; iVar11 = iVar11 + 1) {
    for (lVar24 = (long)iVar20; iVar15 != lVar24; lVar24 = lVar24 + 1) {
      local_48._M_impl.super__Vector_impl_data._M_start[lVar24] = iVar16;
      iVar16 = iVar16 + dilation_w;
    }
    iVar16 = iVar16 + (iVar12 * dilation_h - iVar10);
    iVar15 = iVar15 + kernel_w;
    iVar20 = iVar20 + kernel_w;
  }
  iVar12 = local_d8->w;
  local_70 = local_d8->elemsize;
  local_b8 = local_d8->cstep * local_70;
  local_78 = (long)local_d8->h * (long)iVar12;
  local_80 = local_70 * local_78 + 0xf & 0xfffffffffffffff0;
  local_90 = local_d0->data;
  bVar27 = local_90 != (void *)0x0;
  iVar10 = local_d0->c;
  sVar3 = local_d0->cstep;
  uVar2 = local_b0->c;
  uVar21 = local_d8->h * iVar12;
  uVar14 = 0;
  uVar18 = 0;
  if (0 < (int)uVar9) {
    uVar18 = (ulong)uVar9;
  }
  uVar19 = 0;
  if (0 < (int)uVar2) {
    uVar19 = (ulong)uVar2;
  }
  local_d0 = (Mat *)(ulong)(uint)local_b0->w;
  if (local_b0->w < 1) {
    local_d0 = (Mat *)uVar14;
  }
  local_50 = (ulong)(uint)local_b0->h;
  if (local_b0->h < 1) {
    local_50 = uVar14;
  }
  local_f0 = (ulong)uVar21;
  if ((int)uVar21 < 1) {
    local_f0 = uVar14;
  }
  iVar11 = (int)local_f8;
  local_f8 = local_f8 & 0xffffffff;
  if (iVar11 < 1) {
    local_f8 = uVar14;
  }
  local_68 = (long)stride_h * (long)iVar12 * local_70;
  local_c0 = local_d8->d;
  pvVar22 = local_d8->data;
  local_c4 = local_d8->dims;
  local_d8 = (Mat *)(long)stride_w;
  local_bc = uVar2 * uVar9;
  local_e8 = (ulong)(activation_type - 1);
  local_100 = 0;
  local_88 = pvVar22;
  for (uVar14 = 0; uVar14 != local_f8; uVar14 = uVar14 + 1) {
    iVar12 = (int)(local_80 / local_70);
    if (local_c4 == 4) {
      iVar12 = (int)local_78;
    }
    uVar28 = 0;
    if ((long)iVar10 * sVar3 != 0 && bVar27) {
      uVar28 = *(undefined4 *)((long)local_90 + uVar14 * 4);
    }
    local_a8 = (long)local_100 * 4;
    local_58 = (void *)(local_b8 * uVar14 + (long)local_88);
    iVar12 = iVar12 * local_c0;
    if (iVar12 < 1) {
      iVar12 = 0;
    }
    for (lVar24 = 0; iVar12 != (int)lVar24; lVar24 = lVar24 + 1) {
      *(undefined4 *)((long)pvVar22 + lVar24 * 4) = uVar28;
    }
    for (uVar13 = 0; uVar13 != local_50; uVar13 = uVar13 + 1) {
      pvVar4 = local_60->data;
      for (uVar25 = 0; (Mat *)uVar25 != local_d0; uVar25 = uVar25 + 1) {
        lVar24 = uVar25 * (long)local_d8 * 4 + uVar13 * local_68;
        iVar12 = local_b0->w;
        sVar5 = local_b0->elemsize;
        sVar6 = local_b0->cstep;
        pvVar7 = local_b0->data;
        pvVar23 = (void *)((long)pvVar4 + local_a8);
        for (uVar17 = 0; uVar17 != uVar19; uVar17 = uVar17 + 1) {
          fVar29 = *(float *)((long)pvVar7 +
                             sVar6 * sVar5 * uVar17 + uVar25 * 4 + (long)iVar12 * uVar13 * sVar5);
          for (uVar26 = 0; uVar18 != uVar26; uVar26 = uVar26 + 1) {
            *(float *)((long)local_58 +
                      (long)local_48._M_impl.super__Vector_impl_data._M_start[uVar26] * 4 + lVar24)
                 = *(float *)((long)pvVar23 + uVar26 * 4) * fVar29 +
                   *(float *)((long)local_58 +
                             (long)local_48._M_impl.super__Vector_impl_data._M_start[uVar26] * 4 +
                             lVar24);
          }
          pvVar23 = (void *)((long)pvVar23 + (long)(int)uVar9 * 4);
        }
      }
    }
    pfVar8 = (float *)activation_params->data;
    uVar13 = local_f0;
    uVar25 = local_e8;
    local_e0 = pvVar22;
    for (uVar17 = 0; uVar13 != uVar17; uVar17 = uVar17 + 1) {
      fVar29 = *(float *)((long)pvVar22 + uVar17 * 4);
      fVar30 = fVar29;
      if ((uint)uVar25 < 6) {
        switch((long)&switchD_00262dec::switchdataD_0053a540 +
               (long)(int)(&switchD_00262dec::switchdataD_0053a540)[uVar25]) {
        case 0x262dee:
          if (fVar29 <= 0.0) {
            fVar30 = 0.0;
          }
          break;
        case 0x262dfe:
          local_a8 = (ulong)(uint)fVar29;
          uStack_a0 = 0;
          uStack_9c = 0;
          fVar29 = expf(fVar29);
          fVar29 = logf(fVar29 + 1.0);
          fVar29 = tanhf(fVar29);
          uVar13 = local_f0;
          pvVar22 = local_e0;
          uVar25 = local_e8;
          fVar30 = fVar29 * (float)local_a8;
          break;
        case 0x262e3d:
          if (fVar29 <= *pfVar8) {
            fVar29 = *pfVar8;
          }
          fVar30 = pfVar8[1];
          if (fVar29 <= pfVar8[1]) {
            fVar30 = fVar29;
          }
          break;
        case 0x262e5f:
          if (88.37626 <= fVar29) {
            fVar29 = 88.37626;
          }
          fVar29 = expf((float)(-(uint)(fVar29 < -88.37626) & 0x42b0c0a5 |
                               ~-(uint)(fVar29 < -88.37626) & (uint)-fVar29));
          uVar13 = local_f0;
          pvVar22 = local_e0;
          uVar25 = local_e8;
          fVar30 = 1.0 / (fVar29 + 1.0);
          break;
        case 0x262ebc:
          fVar30 = (float)(~-(uint)(0.0 < fVar29) & (uint)*pfVar8 |
                          -(uint)(0.0 < fVar29) & 0x3f800000) * fVar29;
          break;
        case 0x262ee9:
          fVar1 = *pfVar8;
          fVar31 = -pfVar8[1] / fVar1;
          fVar30 = 0.0;
          if ((fVar31 <= fVar29) && (fVar30 = fVar29, fVar29 <= fVar31 + 1.0 / fVar1)) {
            fVar30 = (fVar1 * fVar29 + pfVar8[1]) * fVar29;
          }
        }
      }
      *(float *)((long)pvVar22 + uVar17 * 4) = fVar30;
    }
    pvVar22 = (void *)((long)pvVar22 + local_b8);
    local_100 = local_100 + local_bc;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return extraout_EAX;
}

Assistant:

static int deconvolution(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data, const Mat& bias_data, int kernel_w, int kernel_h, int stride_w, int stride_h, int dilation_w, int dilation_h, int activation_type, const Mat& activation_params, const Option& opt)
{
    const int outw = top_blob.w;
    const int outch = top_blob.c;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = outw * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out = top_blob.channel(p);

        const float bias = bias_data.empty() ? 0.f : bias_data[p];

        out.fill(bias);

        // shadowed variable for less openmp task args
        const int w = bottom_blob.w;
        const int h = bottom_blob.h;
        const int inch = bottom_blob.c;
        const int outw = top_blob.w;
        const int outh = top_blob.h;

        for (int i = 0; i < h; i++)
        {
            for (int j = 0; j < w; j++)
            {
                float* outptr = out.row(i * stride_h) + j * stride_w;

                const float* kptr = (const float*)weight_data + maxk * inch * p;

                for (int q = 0; q < inch; q++)
                {
                    const float val = bottom_blob.channel(q).row(i)[j];

                    for (int k = 0; k < maxk; k++)
                    {
                        float w = kptr[k];
                        outptr[space_ofs[k]] += val * w;
                    }

                    kptr += maxk;
                }
            }
        }

        {
            float* outptr = out;
            int size = outw * outh;

            for (int i = 0; i < size; i++)
            {
                outptr[i] = activation_ss(outptr[i], activation_type, activation_params);
            }
        }
    }

    return 0;
}